

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O1

void __thiscall
cnn::GRUBuilder::GRUBuilder
          (GRUBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model)

{
  Model *this_00;
  long lVar1;
  Parameters *pPVar2;
  Parameters *pPVar3;
  Parameters *pPVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  initializer_list<cnn::Parameters_*> __l;
  uint v;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> ps;
  allocator_type local_e1;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> local_e0;
  undefined1 local_c8 [16];
  Parameters *local_b8;
  uint uStack_b0;
  uint local_ac;
  uint uStack_a8;
  undefined4 uStack_a4;
  Parameters *local_a0;
  Parameters *local_98;
  Parameters *local_90;
  Parameters *local_88;
  GRUBuilder *local_80;
  Model *local_78;
  uint local_6c;
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  *local_68;
  ulong local_60;
  Parameters *local_58;
  Parameters *local_50;
  Parameters *local_48;
  Parameters *local_40;
  Parameters *local_38;
  
  (this->super_RNNBuilder).cur.t = -1;
  *(undefined8 *)&(this->super_RNNBuilder).sm = 0;
  *(undefined8 *)
   ((long)&(this->super_RNNBuilder).head.
           super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__GRUBuilder_002ab368;
  (this->params).
  super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->hidden_dim = hidden_dim;
  this->layers = layers;
  if (layers != 0) {
    local_68 = &this->params;
    uVar6 = 0;
    local_80 = this;
    local_78 = model;
    local_6c = layers;
    do {
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = input_dim;
      local_ac = 0;
      uStack_a8 = 1;
      lVar1 = 0;
      do {
        uVar5 = (ulong)local_ac;
        local_ac = local_ac + 1;
        *(undefined4 *)(local_c8 + uVar5 * 4) =
             *(undefined4 *)
              ((long)&local_e0.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      local_38 = Model::add_parameters(model,(Dim *)local_c8,0.0);
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_ac = 0;
      uStack_a8 = 1;
      lVar1 = 0;
      do {
        uVar5 = (ulong)local_ac;
        local_ac = local_ac + 1;
        *(undefined4 *)(local_c8 + uVar5 * 4) =
             *(undefined4 *)
              ((long)&local_e0.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      local_40 = Model::add_parameters(model,(Dim *)local_c8,0.0);
      local_ac = 1;
      uStack_a8 = 1;
      local_c8._0_4_ = hidden_dim;
      local_48 = Model::add_parameters(model,(Dim *)local_c8,0.0);
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = input_dim;
      local_ac = 0;
      uStack_a8 = 1;
      lVar1 = 0;
      do {
        uVar5 = (ulong)local_ac;
        local_ac = local_ac + 1;
        *(undefined4 *)(local_c8 + uVar5 * 4) =
             *(undefined4 *)
              ((long)&local_e0.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      local_50 = Model::add_parameters(model,(Dim *)local_c8,0.0);
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_ac = 0;
      uStack_a8 = 1;
      lVar1 = 0;
      do {
        uVar5 = (ulong)local_ac;
        local_ac = local_ac + 1;
        *(undefined4 *)(local_c8 + uVar5 * 4) =
             *(undefined4 *)
              ((long)&local_e0.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      local_60 = uVar6;
      local_58 = Model::add_parameters(model,(Dim *)local_c8,0.0);
      local_ac = 1;
      uStack_a8 = 1;
      pPVar2 = Model::add_parameters(model,(Dim *)local_c8,0.0);
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = input_dim;
      local_ac = 0;
      uStack_a8 = 1;
      lVar1 = 0;
      do {
        uVar6 = (ulong)local_ac;
        local_ac = local_ac + 1;
        *(undefined4 *)(local_c8 + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_e0.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      pPVar3 = Model::add_parameters(local_78,(Dim *)local_c8,0.0);
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_e0.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_ac = 0;
      uStack_a8 = 1;
      lVar1 = 0;
      do {
        uVar6 = (ulong)local_ac;
        local_ac = local_ac + 1;
        *(undefined4 *)(local_c8 + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_e0.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        this_00 = local_78;
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      pPVar4 = Model::add_parameters(local_78,(Dim *)local_c8,0.0);
      local_ac = 1;
      uStack_a8 = 1;
      local_88 = Model::add_parameters(this_00,(Dim *)local_c8,0.0);
      local_c8._0_8_ = local_38;
      local_c8._8_8_ = local_40;
      local_b8 = local_48;
      uStack_b0 = (uint)local_50;
      local_ac = (uint)((ulong)local_50 >> 0x20);
      uStack_a8 = (uint)local_58;
      uStack_a4 = (undefined4)((ulong)local_58 >> 0x20);
      __l._M_len = 9;
      __l._M_array = (iterator)local_c8;
      local_a0 = pPVar2;
      local_98 = pPVar3;
      local_90 = pPVar4;
      std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::vector
                (&local_e0,__l,&local_e1);
      std::
      vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
      ::push_back(local_68,&local_e0);
      uVar6 = local_60;
      model = local_78;
      if ((void *)CONCAT44(local_e0.
                           super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (uint)local_e0.
                                 super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_e0.
                                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)local_e0.
                                               super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start));
      }
      uVar7 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar7;
      input_dim = hidden_dim;
    } while (uVar7 != local_6c);
  }
  return;
}

Assistant:

GRUBuilder::GRUBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       Model* model) : hidden_dim(hidden_dim), layers(layers) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    // z
    Parameters* p_x2z = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2z = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bz = model->add_parameters({hidden_dim});

    // r
    Parameters* p_x2r = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2r = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_br = model->add_parameters({hidden_dim});

    // h
    Parameters* p_x2h = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2h = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bh = model->add_parameters({hidden_dim});
    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameters*> ps = {p_x2z, p_h2z, p_bz, p_x2r, p_h2r, p_br, p_x2h, p_h2h, p_bh};
    params.push_back(ps);
  }  // layers
}